

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O1

CommandSignature __thiscall
anon_unknown.dwarf_1bf255::SwiftCompilerShellCommand::getSignature(SwiftCompilerShellCommand *this)

{
  CommandSignature *pCVar1;
  hash_code hVar2;
  CommandSignature local_a8;
  hash_combine_recursive_helper local_a0;
  
  local_a8 = llbuild::buildsystem::ExternalCommand::getSignature(&this->super_ExternalCommand);
  llvm::hashing::detail::hash_combine_recursive_helper::hash_combine_recursive_helper(&local_a0);
  local_a0.buffer[0] = (undefined1)local_a8.value;
  local_a0.buffer[1] = local_a8.value._1_1_;
  local_a0.buffer[2] = local_a8.value._2_1_;
  local_a0.buffer[3] = local_a8.value._3_1_;
  local_a0.buffer[4] = local_a8.value._4_1_;
  local_a0.buffer[5] = local_a8.value._5_1_;
  local_a0.buffer[6] = local_a8.value._6_1_;
  local_a0.buffer[7] = local_a8.value._7_1_;
  local_a8.value =
       (uint64_t)
       llvm::hashing::detail::hash_combine_recursive_helper::combine<std::__cxx11::string>
                 (&local_a0,0,local_a0.buffer + 8,(char *)&local_a0.state,&this->executable);
  llvm::hashing::detail::hash_combine_recursive_helper::hash_combine_recursive_helper(&local_a0);
  local_a0.buffer[0] = (undefined1)local_a8.value;
  local_a0.buffer[1] = local_a8.value._1_1_;
  local_a0.buffer[2] = local_a8.value._2_1_;
  local_a0.buffer[3] = local_a8.value._3_1_;
  local_a0.buffer[4] = local_a8.value._4_1_;
  local_a0.buffer[5] = local_a8.value._5_1_;
  local_a0.buffer[6] = local_a8.value._6_1_;
  local_a0.buffer[7] = local_a8.value._7_1_;
  local_a8.value =
       (uint64_t)
       llvm::hashing::detail::hash_combine_recursive_helper::combine<std::__cxx11::string>
                 (&local_a0,0,local_a0.buffer + 8,(char *)&local_a0.state,&this->moduleName);
  pCVar1 = llbuild::basic::CommandSignature::combine<std::__cxx11::string>
                     (&local_a8,&this->moduleAliases);
  llvm::hashing::detail::hash_combine_recursive_helper::hash_combine_recursive_helper(&local_a0);
  local_a0.buffer._0_8_ = pCVar1->value;
  hVar2 = llvm::hashing::detail::hash_combine_recursive_helper::combine<std::__cxx11::string>
                    (&local_a0,0,local_a0.buffer + 8,(char *)&local_a0.state,&this->moduleOutputPath
                    );
  pCVar1->value = hVar2.value;
  pCVar1 = llbuild::basic::CommandSignature::combine<std::__cxx11::string>
                     (pCVar1,&this->sourcesList);
  pCVar1 = llbuild::basic::CommandSignature::combine<std::__cxx11::string>
                     (pCVar1,&this->objectsList);
  pCVar1 = llbuild::basic::CommandSignature::combine<std::__cxx11::string>
                     (pCVar1,&this->importPaths);
  llvm::hashing::detail::hash_combine_recursive_helper::hash_combine_recursive_helper(&local_a0);
  local_a0.buffer._0_8_ = pCVar1->value;
  hVar2 = llvm::hashing::detail::hash_combine_recursive_helper::combine<std::__cxx11::string>
                    (&local_a0,0,local_a0.buffer + 8,(char *)&local_a0.state,&this->tempsPath);
  pCVar1->value = hVar2.value;
  pCVar1 = llbuild::basic::CommandSignature::combine<std::__cxx11::string>(pCVar1,&this->otherArgs);
  pCVar1 = llbuild::basic::CommandSignature::combine(pCVar1,this->isLibrary);
  return (CommandSignature)pCVar1->value;
}

Assistant:

virtual CommandSignature getSignature() const override {
    return ExternalCommand::getSignature()
        .combine(executable)
        .combine(moduleName)
        .combine(moduleAliases)
        .combine(moduleOutputPath)
        .combine(sourcesList)
        .combine(objectsList)
        .combine(importPaths)
        .combine(tempsPath)
        .combine(otherArgs)
        .combine(isLibrary);
  }